

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_makeAssociation
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t result,sysbvm_tuple_t key,sysbvm_tuple_t value)

{
  sysbvm_tuple_t sVar1;
  
  sVar1 = sysbvm_array_create(context,3);
  if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
    *(sysbvm_tuple_t *)(sVar1 + 0x10) = result;
    *(sysbvm_tuple_t *)(sVar1 + 0x18) = key;
    *(sysbvm_tuple_t *)(sVar1 + 0x20) = value;
  }
  sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'4',sVar1);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_makeAssociation(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t result, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    sysbvm_tuple_t operands = sysbvm_array_create(context, 3);
    sysbvm_array_atPut(operands, 0, result);
    sysbvm_array_atPut(operands, 1, key);
    sysbvm_array_atPut(operands, 2, value);
    
    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_MAKE_ASSOCIATION, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}